

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::add_all_features
               (example *ex,example *src,uchar tgt_ns,uint64_t mask,uint64_t multiplier,
               uint64_t offset,bool param_7)

{
  byte *pbVar1;
  uchar **ppuVar2;
  v_array<unsigned_long> *this;
  unsigned_long **ppuVar3;
  v_array<unsigned_char> *in_RSI;
  feature_index i;
  unsigned_long *__end3;
  unsigned_long *__begin3;
  v_array<unsigned_long> *__range3;
  namespace_index ns;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  features *tgt_fs;
  features *pfVar4;
  features *this_00;
  byte *local_50;
  
  ppuVar2 = v_array<unsigned_char>::begin(in_RSI);
  local_50 = *ppuVar2;
  ppuVar2 = v_array<unsigned_char>::end(in_RSI);
  pbVar1 = *ppuVar2;
  for (; local_50 != pbVar1; local_50 = local_50 + 1) {
    if (*local_50 != 0x80) {
      this = (v_array<unsigned_long> *)((long)in_RSI + (ulong)*local_50 * 0x68 + 0x40);
      ppuVar3 = v_array<unsigned_long>::begin(this);
      this_00 = (features *)*ppuVar3;
      ppuVar3 = v_array<unsigned_long>::end(this);
      pfVar4 = (features *)*ppuVar3;
      for (; this_00 != pfVar4; this_00 = (features *)&(this_00->values)._end) {
        features::push_back(this_00,(feature_value)((ulong)pfVar4 >> 0x20),
                            (feature_index)(this_00->values)._begin);
      }
    }
  }
  return;
}

Assistant:

void add_all_features(example &ex, example &src, unsigned char tgt_ns, uint64_t mask, uint64_t multiplier,
    uint64_t offset, bool /* audit */ = false)
{
  features &tgt_fs = ex.feature_space[tgt_ns];
  for (namespace_index ns : src.indices)
    if (ns != constant_namespace)  // ignore constant_namespace
      for (feature_index i : src.feature_space[ns].indicies)
        tgt_fs.push_back(1.0f, ((i / multiplier + offset) * multiplier) & mask);
}